

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O2

int decompress_smooth_data(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  jpeg_d_coef_controller *pjVar7;
  JQUANT_TBL *pJVar8;
  inverse_DCT_method_ptr p_Var9;
  _func_void_j_decompress_ptr *p_Var10;
  JBLOCKROW paJVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [12];
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  JBLOCKARRAY ppaJVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  JBLOCKROW paJVar35;
  long lVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  JDIMENSION JVar40;
  ulong uVar41;
  uint uVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  jpeg_component_info *pjVar48;
  int local_1c8;
  JBLOCKROW local_1b0;
  JSAMPARRAY local_1a0;
  JBLOCK workspace;
  
  pjVar7 = cinfo->coef;
  uVar22 = cinfo->total_iMCU_rows - 1;
  while( true ) {
    if (((cinfo->output_scan_number < cinfo->input_scan_number) ||
        (cinfo->inputctl->eoi_reached != 0)) ||
       ((cinfo->input_scan_number == cinfo->output_scan_number &&
        (cinfo->output_iMCU_row + (uint)(cinfo->Ss == 0) < cinfo->input_iMCU_row)))) break;
    iVar23 = (*cinfo->inputctl->consume_input)(cinfo);
    if (iVar23 == 0) {
      return 0;
    }
  }
  pjVar48 = cinfo->comp_info;
  for (lVar30 = 0; lVar30 < cinfo->num_components; lVar30 = lVar30 + 1) {
    if (pjVar48->component_needed != 0) {
      uVar6 = cinfo->output_iMCU_row;
      if (uVar6 < uVar22) {
        uVar42 = pjVar48->v_samp_factor;
        uVar31 = uVar42;
        JVar40 = uVar42 * 2;
      }
      else {
        uVar42 = pjVar48->v_samp_factor;
        uVar31 = (uint)((ulong)pjVar48->height_in_blocks % (ulong)uVar42);
        JVar40 = uVar31;
        if (uVar31 == 0) {
          uVar31 = uVar42;
          JVar40 = uVar42;
        }
      }
      if (uVar6 == 0) {
        ppaJVar26 = (*cinfo->mem->access_virt_barray)
                              ((j_common_ptr)cinfo,
                               (jvirt_barray_ptr)(&pjVar7[3].start_output_pass)[lVar30],0,JVar40,0);
      }
      else {
        ppaJVar26 = (*cinfo->mem->access_virt_barray)
                              ((j_common_ptr)cinfo,
                               (jvirt_barray_ptr)(&pjVar7[3].start_output_pass)[lVar30],
                               (uVar6 - 1) * uVar42,JVar40 + uVar42,0);
        ppaJVar26 = ppaJVar26 + pjVar48->v_samp_factor;
      }
      lVar34 = lVar30 * 0x18;
      pJVar8 = pjVar48->quant_table;
      uVar27 = (ulong)pJVar8->quantval[0];
      uVar1 = pJVar8->quantval[1];
      uVar2 = pJVar8->quantval[8];
      uVar3 = pJVar8->quantval[0x10];
      uVar4 = pJVar8->quantval[9];
      uVar5 = pJVar8->quantval[2];
      p_Var9 = cinfo->idct->inverse_DCT[lVar30];
      uVar42 = uVar31;
      if ((int)uVar31 < 1) {
        uVar42 = 0;
      }
      p_Var10 = pjVar7[5].start_output_pass;
      local_1a0 = output_buf[lVar30];
      for (uVar41 = 0; uVar41 != uVar42; uVar41 = uVar41 + 1) {
        paJVar11 = ppaJVar26[uVar41];
        local_1b0 = paJVar11;
        if (uVar6 != 0 || (int)uVar41 != 0) {
          local_1b0 = ppaJVar26[uVar41 - 1];
        }
        if ((uVar6 < uVar22) || (paJVar35 = paJVar11, uVar41 != uVar31 - 1)) {
          paJVar35 = ppaJVar26[uVar41 + 1];
        }
        uVar24 = pjVar48->width_in_blocks - 1;
        lVar36 = 0;
        JVar40 = 0;
        iVar47 = (int)(*local_1b0)[0];
        iVar25 = (int)(*paJVar35)[0];
        iVar43 = (int)(*paJVar35)[0];
        iVar23 = (int)(*local_1b0)[0];
        local_1c8 = (int)(*paJVar11)[0];
        iVar45 = (int)(*paJVar11)[0];
        for (uVar29 = 0; uVar29 <= uVar24; uVar29 = uVar29 + 1) {
          jcopy_block_row((JBLOCKROW)((long)*paJVar11 + lVar36),&workspace,1);
          iVar44 = iVar23;
          iVar37 = iVar43;
          iVar46 = iVar45;
          if (uVar29 < uVar24) {
            iVar44 = (int)*(short *)((long)local_1b0[1] + lVar36);
            iVar46 = (int)*(short *)((long)paJVar11[1] + lVar36);
            iVar37 = (int)*(short *)((long)paJVar35[1] + lVar36);
          }
          iVar33 = *(int *)(p_Var10 + lVar34 + 4);
          if ((iVar33 != 0) && (workspace[1] == 0)) {
            lVar28 = (long)(local_1c8 - iVar46) * uVar27 * 0x24;
            if (lVar28 < 0) {
              auVar13._8_8_ = 0;
              auVar13._0_8_ = (ulong)uVar1 * 0x80 - lVar28;
              iVar38 = 1 << ((byte)iVar33 & 0x1f);
              iVar32 = SUB164(auVar13 / (ZEXT216(uVar1) << 8),0);
              iVar39 = iVar38 + -1;
              if (iVar32 < iVar38) {
                iVar39 = iVar32;
              }
              if (iVar33 < 1) {
                iVar39 = iVar32;
              }
              workspace[1] = -(short)iVar39;
            }
            else {
              auVar12._8_8_ = 0;
              auVar12._0_8_ = lVar28 + (ulong)uVar1 * 0x80;
              auVar12 = auVar12 / (ZEXT216(uVar1) << 8);
              workspace[1] = auVar12._0_2_;
              if (0 < iVar33) {
                iVar32 = 1 << ((byte)iVar33 & 0x1f);
                iVar39 = auVar12._0_4_;
                iVar33 = iVar32 + -1;
                if (iVar39 < iVar32) {
                  iVar33 = iVar39;
                }
                workspace[1] = (JCOEF)iVar33;
              }
            }
          }
          iVar33 = *(int *)(p_Var10 + lVar34 + 8);
          if ((iVar33 != 0) && (workspace[8] == 0)) {
            lVar28 = (long)(iVar23 - iVar43) * uVar27 * 0x24;
            if (lVar28 < 0) {
              auVar15._8_8_ = 0;
              auVar15._0_8_ = (ulong)uVar2 * 0x80 - lVar28;
              iVar38 = 1 << ((byte)iVar33 & 0x1f);
              iVar32 = SUB164(auVar15 / (ZEXT216(uVar2) << 8),0);
              iVar39 = iVar38 + -1;
              if (iVar32 < iVar38) {
                iVar39 = iVar32;
              }
              if (iVar33 < 1) {
                iVar39 = iVar32;
              }
              workspace[8] = -(short)iVar39;
            }
            else {
              auVar14._8_8_ = 0;
              auVar14._0_8_ = lVar28 + (ulong)uVar2 * 0x80;
              auVar14 = auVar14 / (ZEXT216(uVar2) << 8);
              workspace[8] = auVar14._0_2_;
              if (0 < iVar33) {
                iVar32 = 1 << ((byte)iVar33 & 0x1f);
                iVar39 = auVar14._0_4_;
                iVar33 = iVar32 + -1;
                if (iVar39 < iVar32) {
                  iVar33 = iVar39;
                }
                workspace[8] = (JCOEF)iVar33;
              }
            }
          }
          iVar33 = *(int *)(p_Var10 + lVar34 + 0xc);
          if ((iVar33 != 0) && (workspace[0x10] == 0)) {
            lVar28 = (long)(iVar23 + iVar45 * -2 + iVar43) * uVar27 * 9;
            if (lVar28 < 0) {
              auVar17._8_8_ = 0;
              auVar17._0_8_ = (ulong)uVar3 * 0x80 - lVar28;
              iVar38 = 1 << ((byte)iVar33 & 0x1f);
              iVar32 = SUB164(auVar17 / (ZEXT216(uVar3) << 8),0);
              iVar39 = iVar38 + -1;
              if (iVar32 < iVar38) {
                iVar39 = iVar32;
              }
              if (iVar33 < 1) {
                iVar39 = iVar32;
              }
              workspace[0x10] = -(short)iVar39;
            }
            else {
              auVar16._8_8_ = 0;
              auVar16._0_8_ = lVar28 + (ulong)uVar3 * 0x80;
              auVar16 = auVar16 / (ZEXT216(uVar3) << 8);
              workspace[0x10] = auVar16._0_2_;
              if (0 < iVar33) {
                iVar32 = 1 << ((byte)iVar33 & 0x1f);
                iVar39 = auVar16._0_4_;
                iVar33 = iVar32 + -1;
                if (iVar39 < iVar32) {
                  iVar33 = iVar39;
                }
                workspace[0x10] = (JCOEF)iVar33;
              }
            }
          }
          iVar33 = *(int *)(p_Var10 + lVar34 + 0x10);
          if ((iVar33 != 0) && (workspace[9] == 0)) {
            lVar28 = (long)((iVar47 - (iVar25 + iVar44)) + iVar37) * uVar27 * 5;
            if (lVar28 < 0) {
              auVar19._8_8_ = 0;
              auVar19._0_8_ = (ulong)uVar4 * 0x80 - lVar28;
              iVar39 = 1 << ((byte)iVar33 & 0x1f);
              iVar25 = SUB164(auVar19 / (ZEXT216(uVar4) << 8),0);
              iVar47 = iVar39 + -1;
              if (iVar25 < iVar39) {
                iVar47 = iVar25;
              }
              if (iVar33 < 1) {
                iVar47 = iVar25;
              }
              workspace[9] = -(short)iVar47;
            }
            else {
              auVar18._8_8_ = 0;
              auVar18._0_8_ = lVar28 + (ulong)uVar4 * 0x80;
              auVar18 = auVar18 / (ZEXT216(uVar4) << 8);
              workspace[9] = auVar18._0_2_;
              if (0 < iVar33) {
                iVar33 = 1 << ((byte)iVar33 & 0x1f);
                iVar25 = auVar18._0_4_;
                iVar47 = iVar33 + -1;
                if (iVar25 < iVar33) {
                  iVar47 = iVar25;
                }
                workspace[9] = (JCOEF)iVar47;
              }
            }
          }
          iVar47 = *(int *)(p_Var10 + lVar34 + 0x14);
          if ((iVar47 != 0) && (workspace[2] == 0)) {
            lVar28 = (long)(local_1c8 + iVar45 * -2 + iVar46) * uVar27 * 9;
            if (lVar28 < 0) {
              auVar20._8_8_ = 0;
              auVar20._0_8_ = (ulong)uVar5 * 0x80 - lVar28;
              iVar39 = 1 << ((byte)iVar47 & 0x1f);
              iVar33 = SUB164(auVar20 / (ZEXT216(uVar5) << 8),0);
              iVar25 = iVar39 + -1;
              if (iVar33 < iVar39) {
                iVar25 = iVar33;
              }
              if (iVar47 < 1) {
                iVar25 = iVar33;
              }
              workspace[2] = -(short)iVar25;
            }
            else {
              auVar21._8_4_ = 0;
              auVar21._0_8_ = lVar28 + (ulong)uVar5 * 0x80;
              auVar21 = auVar21 / (ZEXT212(uVar5) << 8);
              workspace[2] = auVar21._0_2_;
              if (0 < iVar47) {
                iVar33 = 1 << ((byte)iVar47 & 0x1f);
                iVar25 = auVar21._0_4_;
                iVar47 = iVar33 + -1;
                if (iVar25 < iVar33) {
                  iVar47 = iVar25;
                }
                workspace[2] = (JCOEF)iVar47;
              }
            }
          }
          (*p_Var9)(cinfo,pjVar48,workspace,local_1a0,JVar40);
          JVar40 = JVar40 + pjVar48->DCT_h_scaled_size;
          lVar36 = lVar36 + 0x80;
          iVar47 = iVar23;
          iVar25 = iVar43;
          iVar43 = iVar37;
          iVar23 = iVar44;
          local_1c8 = iVar45;
          iVar45 = iVar46;
        }
        local_1a0 = local_1a0 + pjVar48->DCT_v_scaled_size;
      }
    }
    pjVar48 = pjVar48 + 1;
  }
  uVar22 = cinfo->output_iMCU_row + 1;
  cinfo->output_iMCU_row = uVar22;
  return 4 - (uint)(uVar22 < cinfo->total_iMCU_rows);
}

Assistant:

METHODDEF(int)
decompress_smooth_data (j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION block_num, last_block_column;
  int ci, block_row, block_rows, access_rows;
  JBLOCKARRAY buffer;
  JBLOCKROW buffer_ptr, prev_block_row, next_block_row;
  JSAMPARRAY output_ptr;
  JDIMENSION output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;
  boolean first_row, last_row;
  JBLOCK workspace;
  int *coef_bits;
  JQUANT_TBL *quanttbl;
  INT32 Q00,Q01,Q02,Q10,Q11,Q20, num;
  int DC1,DC2,DC3,DC4,DC5,DC6,DC7,DC8,DC9;
  int Al, pred;

  /* Force some input to be done if we are getting ahead of the input. */
  while (cinfo->input_scan_number <= cinfo->output_scan_number &&
	 ! cinfo->inputctl->eoi_reached) {
    if (cinfo->input_scan_number == cinfo->output_scan_number) {
      /* If input is working on current scan, we ordinarily want it to
       * have completed the current row.  But if input scan is DC,
       * we want it to keep one row ahead so that next block row's DC
       * values are up to date.
       */
      JDIMENSION delta = (cinfo->Ss == 0) ? 1 : 0;
      if (cinfo->input_iMCU_row > cinfo->output_iMCU_row+delta)
	break;
    }
    if ((*cinfo->inputctl->consume_input)(cinfo) == JPEG_SUSPENDED)
      return JPEG_SUSPENDED;
  }

  /* OK, output from the virtual arrays. */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Don't bother to IDCT an uninteresting component. */
    if (! compptr->component_needed)
      continue;
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (cinfo->output_iMCU_row < last_iMCU_row) {
      block_rows = compptr->v_samp_factor;
      access_rows = block_rows * 2; /* this and next iMCU row */
      last_row = FALSE;
    } else {
      /* NB: can't use last_row_height here; it is input-side-dependent! */
      block_rows = (int) (compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
      access_rows = block_rows; /* this iMCU row only */
      last_row = TRUE;
    }
    /* Align the virtual buffer for this component. */
    if (cinfo->output_iMCU_row > 0) {
      access_rows += compptr->v_samp_factor; /* prior iMCU row too */
      buffer = (*cinfo->mem->access_virt_barray)
	((j_common_ptr) cinfo, coef->whole_image[ci],
	 (cinfo->output_iMCU_row - 1) * compptr->v_samp_factor,
	 (JDIMENSION) access_rows, FALSE);
      buffer += compptr->v_samp_factor;	/* point to current iMCU row */
      first_row = FALSE;
    } else {
      buffer = (*cinfo->mem->access_virt_barray)
	((j_common_ptr) cinfo, coef->whole_image[ci],
	 (JDIMENSION) 0, (JDIMENSION) access_rows, FALSE);
      first_row = TRUE;
    }
    /* Fetch component-dependent info */
    coef_bits = coef->coef_bits_latch + (ci * SAVED_COEFS);
    quanttbl = compptr->quant_table;
    Q00 = quanttbl->quantval[0];
    Q01 = quanttbl->quantval[Q01_POS];
    Q10 = quanttbl->quantval[Q10_POS];
    Q20 = quanttbl->quantval[Q20_POS];
    Q11 = quanttbl->quantval[Q11_POS];
    Q02 = quanttbl->quantval[Q02_POS];
    inverse_DCT = cinfo->idct->inverse_DCT[ci];
    output_ptr = output_buf[ci];
    /* Loop over all DCT blocks to be processed. */
    for (block_row = 0; block_row < block_rows; block_row++) {
      buffer_ptr = buffer[block_row];
      if (first_row && block_row == 0)
	prev_block_row = buffer_ptr;
      else
	prev_block_row = buffer[block_row-1];
      if (last_row && block_row == block_rows-1)
	next_block_row = buffer_ptr;
      else
	next_block_row = buffer[block_row+1];
      /* We fetch the surrounding DC values using a sliding-register approach.
       * Initialize all nine here so as to do the right thing on narrow pics.
       */
      DC1 = DC2 = DC3 = (int) prev_block_row[0][0];
      DC4 = DC5 = DC6 = (int) buffer_ptr[0][0];
      DC7 = DC8 = DC9 = (int) next_block_row[0][0];
      output_col = 0;
      last_block_column = compptr->width_in_blocks - 1;
      for (block_num = 0; block_num <= last_block_column; block_num++) {
	/* Fetch current DCT block into workspace so we can modify it. */
	jcopy_block_row(buffer_ptr, (JBLOCKROW) workspace, (JDIMENSION) 1);
	/* Update DC values */
	if (block_num < last_block_column) {
	  DC3 = (int) prev_block_row[1][0];
	  DC6 = (int) buffer_ptr[1][0];
	  DC9 = (int) next_block_row[1][0];
	}
	/* Compute coefficient estimates per K.8.
	 * An estimate is applied only if coefficient is still zero,
	 * and is not known to be fully accurate.
	 */
	/* AC01 */
	if ((Al=coef_bits[1]) != 0 && workspace[1] == 0) {
	  num = 36 * Q00 * (DC4 - DC6);
	  if (num >= 0) {
	    pred = (int) (((Q01<<7) + num) / (Q01<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q01<<7) - num) / (Q01<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[1] = (JCOEF) pred;
	}
	/* AC10 */
	if ((Al=coef_bits[2]) != 0 && workspace[8] == 0) {
	  num = 36 * Q00 * (DC2 - DC8);
	  if (num >= 0) {
	    pred = (int) (((Q10<<7) + num) / (Q10<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q10<<7) - num) / (Q10<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[8] = (JCOEF) pred;
	}
	/* AC20 */
	if ((Al=coef_bits[3]) != 0 && workspace[16] == 0) {
	  num = 9 * Q00 * (DC2 + DC8 - 2*DC5);
	  if (num >= 0) {
	    pred = (int) (((Q20<<7) + num) / (Q20<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q20<<7) - num) / (Q20<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[16] = (JCOEF) pred;
	}
	/* AC11 */
	if ((Al=coef_bits[4]) != 0 && workspace[9] == 0) {
	  num = 5 * Q00 * (DC1 - DC3 - DC7 + DC9);
	  if (num >= 0) {
	    pred = (int) (((Q11<<7) + num) / (Q11<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q11<<7) - num) / (Q11<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[9] = (JCOEF) pred;
	}
	/* AC02 */
	if ((Al=coef_bits[5]) != 0 && workspace[2] == 0) {
	  num = 9 * Q00 * (DC4 + DC6 - 2*DC5);
	  if (num >= 0) {
	    pred = (int) (((Q02<<7) + num) / (Q02<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q02<<7) - num) / (Q02<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[2] = (JCOEF) pred;
	}
	/* OK, do the IDCT */
	(*inverse_DCT) (cinfo, compptr, (JCOEFPTR) workspace,
			output_ptr, output_col);
	/* Advance for next column */
	DC1 = DC2; DC2 = DC3;
	DC4 = DC5; DC5 = DC6;
	DC7 = DC8; DC8 = DC9;
	buffer_ptr++, prev_block_row++, next_block_row++;
	output_col += compptr->DCT_h_scaled_size;
      }
      output_ptr += compptr->DCT_v_scaled_size;
    }
  }

  if (++(cinfo->output_iMCU_row) < cinfo->total_iMCU_rows)
    return JPEG_ROW_COMPLETED;
  return JPEG_SCAN_COMPLETED;
}